

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O3

ShaderCreateInfoWrapper * __thiscall
Diligent::ShaderCreateInfoWrapper::operator=
          (ShaderCreateInfoWrapper *this,ShaderCreateInfoWrapper *rhs)

{
  void *pvVar1;
  void *ptr;
  uint3 uStack_2b;
  
  memcpy(this,rhs,0x98);
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::operator=
            (&this->m_SourceFactory,&rhs->m_SourceFactory);
  pvVar1 = (rhs->m_pRawMemory)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (rhs->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  ptr = (this->m_pRawMemory)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = pvVar1;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pRawMemory,ptr);
  }
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (IMemoryAllocator *)
         (rhs->m_pRawMemory)._M_t.
         super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
         super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
         super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
         super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
         _M_head_impl;
  (rhs->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (rhs->m_CreateInfo).field_4.SourceLength = 0;
  (rhs->m_CreateInfo).Source = (Char *)0x0;
  (rhs->m_CreateInfo).ByteCode = (void *)0x0;
  (rhs->m_CreateInfo).FilePath = (Char *)0x0;
  (rhs->m_CreateInfo).pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
  (rhs->m_CreateInfo).EntryPoint = "main";
  (rhs->m_CreateInfo).Macros.Elements = (ShaderMacro *)0x0;
  (rhs->m_CreateInfo).Macros.Count = 0;
  (rhs->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = (Char *)0x0;
  (rhs->m_CreateInfo).Desc.ShaderType = SHADER_TYPE_UNKNOWN;
  (rhs->m_CreateInfo).Desc.UseCombinedTextureSamplers = false;
  (rhs->m_CreateInfo).Desc.CombinedSamplerSuffix = "_sampler";
  (rhs->m_CreateInfo).SourceLanguage = SHADER_SOURCE_LANGUAGE_DEFAULT;
  (rhs->m_CreateInfo).ShaderCompiler = SHADER_COMPILER_DEFAULT;
  (rhs->m_CreateInfo).HLSLVersion.Major = 0;
  (rhs->m_CreateInfo).HLSLVersion.Minor = 0;
  (rhs->m_CreateInfo).GLSLVersion.Major = 0;
  (rhs->m_CreateInfo).GLSLVersion.Minor = 0;
  (rhs->m_CreateInfo).GLESSLVersion.Major = 0;
  (rhs->m_CreateInfo).GLESSLVersion.Minor = 0;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).GLESSLVersion.Minor + 1) = 0;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).MSLVersion.Minor + 1) = 0;
  *(ulong *)&(rhs->m_CreateInfo).field_0x85 = (ulong)uStack_2b;
  *(undefined8 *)((long)&(rhs->m_CreateInfo).GLSLExtensions + 5) = 0;
  *(undefined4 *)((long)&(rhs->m_CreateInfo).WebGPUEmulatedArrayIndexSuffix + 4) = 0;
  return this;
}

Assistant:

ShaderCreateInfoWrapper& operator=(ShaderCreateInfoWrapper&& rhs) noexcept
    {
        m_CreateInfo    = rhs.m_CreateInfo;
        m_SourceFactory = std::move(rhs.m_SourceFactory);
        m_pRawMemory    = std::move(rhs.m_pRawMemory);

        rhs.m_CreateInfo = {};

        return *this;
    }